

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O3

void stable_merge_sort_in_place(int **dst,size_t len)

{
  int **ppiVar1;
  size_t len_00;
  int *piVar2;
  int *_sort_swap_temp;
  ulong uVar3;
  long lVar4;
  byte bVar5;
  long lVar6;
  size_t sVar7;
  int **ppiVar8;
  ulong l1;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int **ppiVar12;
  size_t sVar13;
  ulong uVar14;
  bool bVar15;
  
  if (0xf < len) {
    ppiVar1 = dst + -1;
    do {
      lVar6 = 0x3f;
      if (len != 0) {
        for (; len >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      bVar5 = (byte)((uint)(byte)(((byte)lVar6 ^ 0x3f) * -2 + 0x7c) * 0x56 >> 8);
      sVar7 = 1L << (bVar5 & 0x3f);
      uVar3 = (len >> (bVar5 & 0x3f)) - 1 << (bVar5 & 0x3f);
      if (len == 0x10) {
        len = 0x10;
        goto LAB_00108e20;
      }
      if (1 < uVar3) {
        uVar14 = 2;
        ppiVar8 = dst + 2;
        ppiVar12 = ppiVar1;
        do {
          piVar2 = ppiVar12[2];
          if (*piVar2 < *ppiVar12[1]) {
            ppiVar12[2] = ppiVar12[1];
            ppiVar12[1] = piVar2;
          }
          ppiVar12 = ppiVar12 + 2;
          if ((uVar14 & 2) == 0) {
            uVar10 = len - uVar14;
            l1 = 2;
LAB_00108c29:
            if (**(int **)((long)ppiVar12 + ((long)-(l1 << 0x20) >> 0x1d)) <= *ppiVar12[1 - l1])
            goto code_r0x00108c4d;
            uVar11 = l1;
            if (uVar10 <= l1) goto LAB_00108cfb;
            lVar4 = -l1;
            lVar6 = lVar4;
            do {
              piVar2 = ppiVar8[lVar6];
              ppiVar8[lVar6] = dst[len + lVar6];
              dst[len + lVar6] = piVar2;
              lVar6 = lVar6 + 1;
            } while (lVar6 != 0);
            uVar11 = l1 * 2;
            uVar9 = l1;
            if ((uVar11 & uVar14) == 0 && (uVar11 < uVar10 || uVar11 - uVar10 == 0)) {
              do {
                l1 = uVar11;
                stable_merge_sort_in_place_frontmerge
                          (dst + (uVar14 - l1),uVar9,dst + (len - l1) + uVar9,uVar9);
                uVar11 = l1 * 2;
                if (uVar10 < uVar11) break;
                uVar9 = l1;
              } while ((uVar11 & uVar14) == 0);
              lVar4 = -l1;
            }
            stable_merge_sort_in_place_backmerge(ppiVar1 + len,l1,ppiVar12 + lVar4,l1);
            l1 = uVar11;
LAB_00108cfb:
            do {
              uVar9 = l1;
              l1 = uVar9 >> 1;
            } while (uVar10 < uVar9);
            while ((uVar11 & uVar14) == 0) {
              stable_merge_sort_in_place_rmerge
                        (dst + uVar14 + uVar11 * -2,uVar11 * 2,uVar11 & 0x7ffffffffffffffe,uVar9);
              uVar11 = uVar11 * 2;
            }
          }
LAB_00108d45:
          uVar14 = uVar14 + 2;
          ppiVar8 = ppiVar8 + 2;
        } while (uVar14 <= uVar3);
      }
      if (sVar7 < uVar3) {
        sVar13 = 0;
        uVar14 = sVar7;
        do {
          if (((uVar14 & uVar3) != 0) &&
             (len_00 = sVar13 + uVar14, bVar15 = sVar13 != 0, sVar13 = len_00, bVar15)) {
            stable_merge_sort_in_place_rmerge(dst + (uVar3 - len_00),len_00,uVar14,sVar7);
          }
          uVar14 = uVar14 * 2;
        } while (uVar14 < uVar3);
      }
      sVar13 = len - uVar3;
      ppiVar8 = dst + uVar3;
      stable_merge_sort_in_place(ppiVar8,sVar13);
      sVar7 = 0;
      do {
        piVar2 = dst[sVar7];
        dst[sVar7] = ppiVar8[sVar7];
        ppiVar8[sVar7] = piVar2;
        sVar7 = sVar7 + 1;
      } while (sVar13 != sVar7);
      sVar7 = stable_merge_sort_in_place_backmerge
                        (ppiVar1 + sVar13,sVar13,ppiVar8 + -1,uVar3 - sVar13);
      len = sVar7 + sVar13;
    } while (0xf < len);
  }
  if (len < 2) {
    return;
  }
LAB_00108e20:
  stable_bitonic_sort(dst,len);
  return;
code_r0x00108c4d:
  l1 = l1 * 2;
  if ((l1 & uVar14) != 0) goto LAB_00108d45;
  goto LAB_00108c29;
}

Assistant:

void MERGE_SORT_IN_PLACE(SORT_TYPE *dst, const size_t len) {
  /* don't bother sorting an array of size <= 1 */
  size_t r = rbnd(len);
  size_t lr = (len / r - 1) * r;
  SORT_TYPE *dst1 = dst - 1;
  size_t p, m, q, q1, p0;

  if (len <= 1) {
    return;
  }

  if (len <= SMALL_SORT_BND) {
    SMALL_SORT(dst, len);
    return;
  }

  for (p = 2; p <= lr; p += 2) {
    dst1 += 2;

    if (SORT_CMP(dst1[0], dst1[-1]) < 0) {
      SORT_SWAP(dst1[0], dst1[-1]);
    }

    if (p & 2) {
      continue;
    }

    m = len - p;
    q = 2;

    while ((p & q) == 0) {
      if (SORT_CMP(dst1[1 - q], dst1[-(int)q]) < 0) {
        break;
      }

      q *= 2;
    }

    if (p & q) {
      continue;
    }

    if (q < m) {
      p0 = len - q;
      MERGE_SORT_IN_PLACE_ASWAP(dst + p - q, dst + p0, q);

      for (;;) {
        q1 = 2 * q;

        if ((q1 > m) || (p & q1)) {
          break;
        }

        p0 = len - q1;
        MERGE_SORT_IN_PLACE_FRONTMERGE(dst + (p - q1), q, dst + p0 + q, q);
        q = q1;
      }

      MERGE_SORT_IN_PLACE_BACKMERGE(dst + (len - 1), q, dst1 - q, q);
      q *= 2;
    }

    q1 = q;

    while (q1 > m) {
      q1 /= 2;
    }

    while ((q & p) == 0) {
      q *= 2;
      MERGE_SORT_IN_PLACE_RMERGE(dst + (p - q), q, q / 2, q1);
    }
  }

  q1 = 0;

  for (q = r; q < lr; q *= 2) {
    if ((lr & q) != 0) {
      q1 += q;

      if (q1 != q) {
        MERGE_SORT_IN_PLACE_RMERGE(dst + (lr - q1), q1, q, r);
      }
    }
  }

  m = len - lr;
  MERGE_SORT_IN_PLACE(dst + lr, m);
  MERGE_SORT_IN_PLACE_ASWAP(dst, dst + lr, m);
  m += MERGE_SORT_IN_PLACE_BACKMERGE(dst + (m - 1), m, dst + (lr - 1), lr - m);
  MERGE_SORT_IN_PLACE(dst, m);
}